

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket_location_handler.c
# Opt level: O1

void test_ws_location_http_versions(void)

{
  undefined4 uVar1;
  int iVar2;
  cio_error cVar3;
  cio_http_cb_return cVar4;
  uint i;
  long lVar5;
  cio_websocket_location_handler handler;
  cio_http_client client;
  cio_websocket_location_handler cStack_948;
  cio_http_client local_400;
  
  lVar5 = 0;
  do {
    uVar1 = (&DAT_001066d0)[lVar5 * 2];
    iVar2 = (&DAT_001066d4)[lVar5 * 2];
    cVar3 = cio_websocket_location_handler_init
                      (&cStack_948,(char **)0x0,0,on_connect,fake_handler_free);
    UnityAssertEqualNumber
              (0,(long)cVar3,"web socket handler initialization failed!",0x9f,
               UNITY_DISPLAY_STYLE_INT);
    local_400.add_response_header = fake_add_response_header;
    local_400.write_response = fake_write_response;
    local_400.parser._23_1_ = local_400.parser._23_1_ | 0x80;
    local_400.http_method = CIO_HTTP_GET;
    cStack_948.websocket.ws_private.http_client = &local_400;
    local_400._216_4_ = uVar1;
    local_400.current_handler = &cStack_948.http_location;
    cVar4 = (*cStack_948.http_location.on_header_field_name)
                      (&local_400,"Sec-WebSocket-Version",0x15);
    UnityAssertEqualNumber
              (0,(long)cVar4,"on_header_field returned wrong value for sec_ws_version_field",0xb0,
               UNITY_DISPLAY_STYLE_INT);
    cVar4 = (*cStack_948.http_location.on_header_field_value)
                      (cStack_948.websocket.ws_private.http_client,"13",2);
    UnityAssertEqualNumber
              (0,(long)cVar4,"on_header_value returned wrong value for sec_ws_version_value",0xb2,
               UNITY_DISPLAY_STYLE_INT);
    cVar4 = (*cStack_948.http_location.on_header_field_name)
                      (cStack_948.websocket.ws_private.http_client,"Sec-WebSocket-Key",0x11);
    UnityAssertEqualNumber
              (0,(long)cVar4,"on_header_field returned wrong value for sec_ws_key_field",0xb7,
               UNITY_DISPLAY_STYLE_INT);
    cVar4 = (*cStack_948.http_location.on_header_field_value)
                      (cStack_948.websocket.ws_private.http_client,"dGhlIHNhbXBsZSBub25jZQ==",0x18);
    UnityAssertEqualNumber
              (0,(long)cVar4,"on_header_value returned wrong value for sec_ws_key_value",0xb9,
               UNITY_DISPLAY_STYLE_INT);
    cVar4 = (*cStack_948.http_location.on_headers_complete)
                      (cStack_948.websocket.ws_private.http_client);
    UnityAssertEqualNumber
              ((long)iVar2,(long)cVar4,"on_header_complete returned wrong value",0xbc,
               UNITY_DISPLAY_STYLE_INT);
    if ((long)iVar2 == 1) {
      UnityAssertEqualNumber
                (1,(ulong)fake_write_response_fake.call_count,"write_response was not called",0xbe,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (1,(ulong)on_connect_fake.call_count,"websocket on_connect was not called",0xbf,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (0x65,(ulong)fake_write_response_fake.arg1_val,
                 "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS",0xc0,
                 UNITY_DISPLAY_STYLE_INT);
    }
    memset(&fff,0,0x194);
    memset(&cio_http_location_handler_init_fake,0,0x1c0);
    cio_http_location_handler_init_fake.arg_history_len = 0x32;
    memset(&cio_websocket_server_init_fake,0,0x5c8);
    cio_websocket_server_init_fake.arg_history_len = 0x32;
    memset(&fake_handler_free_fake,0,0x1c0);
    fake_handler_free_fake.arg_history_len = 0x32;
    memset(&fake_add_response_header_fake,0,0x358);
    fake_add_response_header_fake.arg_history_len = 0x32;
    memset(&fake_write_response_fake,0,0x698);
    fake_write_response_fake.arg_history_len = 0x32;
    memset(&on_connect_fake,0,0x1c0);
    on_connect_fake.arg_history_len = 0x32;
    memset(&on_error_fake,0,0x358);
    on_error_fake.arg_history_len = 0x32;
    memset(&client_close_fake,0,0x1c0);
    client_close_fake.arg_history_len = 0x32;
    cio_websocket_server_init_fake.custom_fake = websocket_init_save_params;
    fake_write_response_fake.custom_fake = write_response_call_callback;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

static void test_ws_location_http_versions(void)
{
	struct upgrade_test {
		uint16_t major;
		uint16_t minor;
		enum cio_http_cb_return expected_ret_val;
	};

	struct upgrade_test tests[] = {
	    {.major = 1, .minor = 1, .expected_ret_val = CIO_HTTP_CB_SKIP_BODY},
	    {.major = 2, .minor = 0, .expected_ret_val = CIO_HTTP_CB_SKIP_BODY},
	    {.major = 1, .minor = 0, .expected_ret_val = CIO_HTTP_CB_ERROR},
	    {.major = 0, .minor = 9, .expected_ret_val = CIO_HTTP_CB_ERROR},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct upgrade_test test = tests[i];

		struct cio_websocket_location_handler handler;
		enum cio_error err = cio_websocket_location_handler_init(&handler, NULL, 0, on_connect, fake_handler_free);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "web socket handler initialization failed!");

		struct cio_http_client client;

		handler.websocket.ws_private.http_client = &client;
		handler.websocket.ws_private.http_client->current_handler = &handler.http_location;
		handler.websocket.ws_private.http_client->add_response_header = fake_add_response_header;
		handler.websocket.ws_private.http_client->write_response = fake_write_response;

		handler.websocket.ws_private.http_client->parser.upgrade = 1;
		handler.websocket.ws_private.http_client->http_method = CIO_HTTP_GET;
		handler.websocket.ws_private.http_client->http_major = test.major;
		handler.websocket.ws_private.http_client->http_minor = test.minor;

		static const char sec_ws_version_field[] = "Sec-WebSocket-Version";
		static const char sec_ws_version_value[] = "13";
		enum cio_http_cb_return cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_version_field, sizeof(sec_ws_version_field) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_version_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_version_value, sizeof(sec_ws_version_value) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_version_value");

		static const char sec_ws_key_field[] = "Sec-WebSocket-Key";
		static const char sec_ws_key_value[] = "dGhlIHNhbXBsZSBub25jZQ==";
		cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_key_field, sizeof(sec_ws_key_field) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_key_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_key_value, sizeof(sec_ws_key_value) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_key_value");

		cb_ret = handler.http_location.on_headers_complete(handler.websocket.ws_private.http_client);
		TEST_ASSERT_EQUAL_MESSAGE(test.expected_ret_val, cb_ret, "on_header_complete returned wrong value");
		if (test.expected_ret_val == CIO_HTTP_CB_SKIP_BODY) {
			TEST_ASSERT_EQUAL_MESSAGE(1, fake_write_response_fake.call_count, "write_response was not called");
			TEST_ASSERT_EQUAL_MESSAGE(1, on_connect_fake.call_count, "websocket on_connect was not called");
			TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_STATUS_SWITCHING_PROTOCOLS, fake_write_response_fake.arg1_val, "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS");
		}

		setUp();
	}
}